

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O0

bool __thiscall RingBuffer<65536,_float>::Feed(RingBuffer<65536,_float> *this,float *input)

{
  int local_2c;
  int w;
  float *input_local;
  RingBuffer<65536,_float> *this_local;
  
  if (this->writepos == 0xffff) {
    local_2c = 0;
  }
  else {
    local_2c = this->writepos + 1;
  }
  this->buffer[local_2c] = *input;
  this->writepos = local_2c;
  return true;
}

Assistant:

inline bool Feed(const T& input)
    {
        int w = (writepos == LENGTH - 1) ? 0 : (writepos + 1);
        buffer[w] = input;
        writepos = w;
        return true;
    }